

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O3

PersistentColumnData * __thiscall
duckdb::StandardColumnCheckpointState::ToPersistentData
          (PersistentColumnData *__return_storage_ptr__,StandardColumnCheckpointState *this)

{
  pointer pCVar1;
  PersistentColumnData local_50;
  
  ColumnCheckpointState::ToPersistentData(__return_storage_ptr__,&this->super_ColumnCheckpointState)
  ;
  pCVar1 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator->(&this->validity_state);
  (*pCVar1->_vptr_ColumnCheckpointState[5])(&local_50,pCVar1);
  ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
  emplace_back<duckdb::PersistentColumnData>
            (&(__return_storage_ptr__->child_columns).
              super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
             ,&local_50);
  PersistentColumnData::~PersistentColumnData(&local_50);
  return __return_storage_ptr__;
}

Assistant:

PersistentColumnData ToPersistentData() override {
		auto data = ColumnCheckpointState::ToPersistentData();
		data.child_columns.push_back(validity_state->ToPersistentData());
		return data;
	}